

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O3

opcode_t token2opcode(gtoken_t op)

{
  uint uVar1;
  
  uVar1 = op - TOK_KEY_ISA;
  if ((uVar1 < 0x28) && ((0x8007ff3ff9U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
    return *(opcode_t *)(&DAT_0014405c + (ulong)uVar1 * 4);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                ,0x88,"opcode_t token2opcode(gtoken_t)");
}

Assistant:

static opcode_t token2opcode (gtoken_t op) {
    switch (op) {
        // BIT
        case TOK_OP_SHIFT_LEFT: return LSHIFT;
        case TOK_OP_SHIFT_RIGHT: return RSHIFT;
        case TOK_OP_BIT_NOT: return BNOT;
        case TOK_OP_BIT_AND: return BAND;
        case TOK_OP_BIT_OR: return BOR;
        case TOK_OP_BIT_XOR: return BXOR;

        // MATH
        case TOK_OP_ADD: return ADD;
        case TOK_OP_SUB: return SUB;
        case TOK_OP_DIV: return DIV;
        case TOK_OP_MUL: return MUL;
        case TOK_OP_REM: return REM;
        // NEG not handled here

        // COMPARISON
        case TOK_KEY_ISA: return ISA;
        case TOK_OP_LESS: return LT;
        case TOK_OP_GREATER: return GT;
        case TOK_OP_LESS_EQUAL: return LEQ;
        case TOK_OP_GREATER_EQUAL: return GEQ;
        case TOK_OP_ISEQUAL: return EQ;
        case TOK_OP_ISNOTEQUAL: return NEQ;
        case TOK_OP_ISIDENTICAL: return EQQ;
        case TOK_OP_ISNOTIDENTICAL: return NEQQ;
        case TOK_OP_PATTERN_MATCH: return MATCH;

        // LOGICAL
        case TOK_OP_AND: return AND;
        case TOK_OP_NOT: return NOT;
        case TOK_OP_OR: return OR;

        default: assert(0); break;  // should never reach this point
    }

    // should never reach this point
    assert(0);
    return NOT;
}